

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void get_limit(uint8_t *bl,uint8_t *l,uint8_t *t,int bd,__m128i *blt,__m128i *lt,__m128i *thr,
              __m128i *t80_out)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined2 uVar5;
  uint uVar6;
  __m128i alVar7;
  char local_134;
  byte local_e8;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  byte bStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  byte local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  byte bStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  byte local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  byte bStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  __m128i x;
  __m128i zero;
  int shift;
  __m128i *lt_local;
  __m128i *blt_local;
  int bd_local;
  uint8_t *t_local;
  uint8_t *l_local;
  uint8_t *bl_local;
  
  uVar6 = bd - 8;
  uVar1 = *(undefined8 *)bl;
  local_a8 = (byte)uVar1;
  uStack_a7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_a6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_a5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_a4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_a3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_a2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_a1 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar4[1] = 0;
  auVar4[0] = local_a8;
  auVar4[2] = uStack_a7;
  auVar4[3] = 0;
  auVar4[4] = uStack_a6;
  auVar4[5] = 0;
  auVar4[6] = uStack_a5;
  auVar4[7] = 0;
  auVar4[9] = 0;
  auVar4[8] = bStack_a4;
  auVar4[10] = uStack_a3;
  auVar4[0xb] = 0;
  auVar4[0xc] = uStack_a2;
  auVar4[0xd] = 0;
  auVar4[0xe] = uStack_a1;
  auVar4[0xf] = 0;
  alVar7 = (__m128i)psllw(auVar4,ZEXT416(uVar6));
  *blt = alVar7;
  uVar1 = *(undefined8 *)l;
  local_c8 = (byte)uVar1;
  uStack_c7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_c6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_c5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_c4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_c3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_c2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_c1 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar3[1] = 0;
  auVar3[0] = local_c8;
  auVar3[2] = uStack_c7;
  auVar3[3] = 0;
  auVar3[4] = uStack_c6;
  auVar3[5] = 0;
  auVar3[6] = uStack_c5;
  auVar3[7] = 0;
  auVar3[9] = 0;
  auVar3[8] = bStack_c4;
  auVar3[10] = uStack_c3;
  auVar3[0xb] = 0;
  auVar3[0xc] = uStack_c2;
  auVar3[0xd] = 0;
  auVar3[0xe] = uStack_c1;
  auVar3[0xf] = 0;
  alVar7 = (__m128i)psllw(auVar3,ZEXT416(uVar6));
  *lt = alVar7;
  uVar1 = *(undefined8 *)t;
  local_e8 = (byte)uVar1;
  uStack_e7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_e6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_e5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_e4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_e3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_e2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_e1 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar2[1] = 0;
  auVar2[0] = local_e8;
  auVar2[2] = uStack_e7;
  auVar2[3] = 0;
  auVar2[4] = uStack_e6;
  auVar2[5] = 0;
  auVar2[6] = uStack_e5;
  auVar2[7] = 0;
  auVar2[9] = 0;
  auVar2[8] = bStack_e4;
  auVar2[10] = uStack_e3;
  auVar2[0xb] = 0;
  auVar2[0xc] = uStack_e2;
  auVar2[0xd] = 0;
  auVar2[0xe] = uStack_e1;
  auVar2[0xf] = 0;
  alVar7 = (__m128i)psllw(auVar2,ZEXT416(uVar6));
  *thr = alVar7;
  local_134 = (char)bd;
  uVar5 = (undefined2)(1 << (local_134 - 1U & 0x1f));
  (*t80_out)[0] = CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5)));
  (*t80_out)[1] = CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5)));
  return;
}

Assistant:

static inline void get_limit(const uint8_t *bl, const uint8_t *l,
                             const uint8_t *t, int bd, __m128i *blt,
                             __m128i *lt, __m128i *thr, __m128i *t80_out) {
  const int shift = bd - 8;
  const __m128i zero = _mm_setzero_si128();

  __m128i x = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)bl), zero);
  *blt = _mm_slli_epi16(x, shift);

  x = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)l), zero);
  *lt = _mm_slli_epi16(x, shift);

  x = _mm_unpacklo_epi8(_mm_load_si128((const __m128i *)t), zero);
  *thr = _mm_slli_epi16(x, shift);

  *t80_out = _mm_set1_epi16(1 << (bd - 1));
}